

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_script.cpp
# Opt level: O2

Script * cfd::core::ContractHashUtil::GetContractScript
                   (Script *__return_storage_ptr__,Script *claim_script,Script *fedpeg_script)

{
  bool bVar1;
  bool bVar2;
  ScriptOperator *this;
  size_t sVar3;
  byte bVar4;
  pointer this_00;
  ScriptBuilder builder;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_d8;
  ByteData256 tweak;
  ByteData pubkey_data;
  ByteData claim_script_data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ByteData data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  bVar1 = CheckLiquidV1Watchman(fedpeg_script);
  builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_005ba258;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Script::GetData(&claim_script_data,claim_script);
  ByteData::ByteData(&pubkey_data);
  ByteData256::ByteData256(&tweak);
  Script::GetElementList(&local_d8,fedpeg_script);
  bVar4 = 0;
  this_00 = local_d8.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_00 ==
        local_d8.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                (&local_d8);
      ScriptBuilder::Build(__return_storage_ptr__,&builder);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_data);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&claim_script_data);
      ScriptBuilder::~ScriptBuilder(&builder);
      return __return_storage_ptr__;
    }
    if (bVar1) {
      this = ScriptElement::GetOpCode(this_00);
      bVar2 = ScriptOperator::operator==(this,(ScriptOperator *)ScriptOperator::OP_ELSE);
      bVar4 = bVar4 | bVar2;
    }
    ScriptElement::GetBinaryData(&data,this_00);
    if ((bVar4 == 0) && (this_00->type_ == kElementBinary)) {
      sVar3 = ByteData::GetDataSize(&data);
      if (sVar3 != 0x21) goto LAB_003a33ff;
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&data);
      CryptoUtil::HmacSha256
                ((ByteData256 *)&local_48,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                 &claim_script_data);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&tweak.data_,&local_48);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
      WallyUtil::AddTweakPubkey((ByteData *)&local_48,&data,&tweak,true);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&pubkey_data.data_,&local_48);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
      ScriptBuilder::AppendData(&builder,&pubkey_data);
    }
    else {
LAB_003a33ff:
      ScriptBuilder::AppendElement(&builder,this_00);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

Script ContractHashUtil::GetContractScript(
    const Script& claim_script, const Script& fedpeg_script) {
  bool is_liquidv1_watchman = CheckLiquidV1Watchman(fedpeg_script);

  ScriptBuilder builder;
  ByteData claim_script_data = claim_script.GetData();
  bool liquidv1_op_else = false;
  ByteData pubkey_data;
  ByteData256 tweak;
  for (const ScriptElement& element : fedpeg_script.GetElementList()) {
    if (is_liquidv1_watchman &&
        (element.GetOpCode() == ScriptOperator::OP_ELSE)) {
      liquidv1_op_else = true;
    }
    ByteData data = element.GetBinaryData();
    if ((!liquidv1_op_else) && element.IsBinary() &&
        (data.GetDataSize() == Pubkey::kCompressedPubkeySize)) {
      tweak = CryptoUtil::HmacSha256(data.GetBytes(), claim_script_data);
      pubkey_data = WallyUtil::AddTweakPubkey(data, tweak, true);
      builder.AppendData(pubkey_data);
    } else {
      builder.AppendElement(element);
    }
  }

  return builder.Build();
}